

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

void * __thiscall Arena::alloc(Arena *this,size_t size)

{
  SizeToChunkSortedMap *this_00;
  _Base_ptr p_Var1;
  iterator __position;
  void *pvVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Base_ptr *__args_1;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>,_bool>
  pVar5;
  iterator it_remaining;
  size_t size_remaining;
  long local_58;
  _Base_ptr local_50;
  unsigned_long local_48;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = -this->alignment & (size + this->alignment) - 1;
  if (local_40 != 0) {
    this_00 = &this->size_to_free_chunk;
    __position = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_void_*>,_std::_Select1st<std::pair<const_unsigned_long,_void_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
                 ::lower_bound(&this_00->_M_t,&local_40);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header) {
      local_48 = *(long *)(__position._M_node + 1) - local_40;
      __args_1 = &__position._M_node[1]._M_parent;
      p_Var1 = __position._M_node[1]._M_parent;
      local_50 = (_Base_ptr)(local_48 + (long)p_Var1);
      pVar5 = std::
              _Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<char*,unsigned_long&>
                        ((_Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->chunks_used,&local_50,&local_40);
      local_50 = (_Base_ptr)((long)&p_Var1->_M_color + *(long *)(__position._M_node + 1));
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->chunks_free_end)._M_h,&local_50,pVar5._8_8_);
      if (*(ulong *)(__position._M_node + 1) == local_40) {
        std::
        _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->chunks_free)._M_h,__args_1);
      }
      else {
        iVar3 = std::
                _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                ::_M_emplace_equal<unsigned_long_const&,void*&>
                          ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                            *)this_00,&local_48,__args_1);
        local_50 = iVar3._M_node;
        pmVar4 = std::__detail::
                 _Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->chunks_free,__args_1);
        pmVar4->_M_node = iVar3._M_node;
        local_58 = (long)&p_Var1->_M_color + local_48;
        std::
        _Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<char*,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
                  ((_Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->chunks_free_end,&local_58,&local_50);
      }
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                          *)this_00,__position);
      pvVar2 = *(void **)((long)pVar5.first.
                                super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>
                         + 8);
      goto LAB_00629329;
    }
  }
  pvVar2 = (void *)0x0;
LAB_00629329:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pvVar2;
  }
  __stack_chk_fail();
}

Assistant:

void* Arena::alloc(size_t size)
{
    // Round to next multiple of alignment
    size = align_up(size, alignment);

    // Don't handle zero-sized chunks
    if (size == 0)
        return nullptr;

    // Pick a large enough free-chunk. Returns an iterator pointing to the first element that is not less than key.
    // This allocation strategy is best-fit. According to "Dynamic Storage Allocation: A Survey and Critical Review",
    // Wilson et. al. 1995, https://www.scs.stanford.edu/14wi-cs140/sched/readings/wilson.pdf, best-fit and first-fit
    // policies seem to work well in practice.
    auto size_ptr_it = size_to_free_chunk.lower_bound(size);
    if (size_ptr_it == size_to_free_chunk.end())
        return nullptr;

    // Create the used-chunk, taking its space from the end of the free-chunk
    const size_t size_remaining = size_ptr_it->first - size;
    char* const free_chunk = static_cast<char*>(size_ptr_it->second);
    auto allocated = chunks_used.emplace(free_chunk + size_remaining, size).first;
    chunks_free_end.erase(free_chunk + size_ptr_it->first);
    if (size_ptr_it->first == size) {
        // whole chunk is used up
        chunks_free.erase(size_ptr_it->second);
    } else {
        // still some memory left in the chunk
        auto it_remaining = size_to_free_chunk.emplace(size_remaining, size_ptr_it->second);
        chunks_free[size_ptr_it->second] = it_remaining;
        chunks_free_end.emplace(free_chunk + size_remaining, it_remaining);
    }
    size_to_free_chunk.erase(size_ptr_it);

    return allocated->first;
}